

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O1

void __thiscall tinyusdz::ListOp<tinyusdz::Path>::ClearAndMakeExplicit(ListOp<tinyusdz::Path> *this)

{
  pointer pPVar1;
  pointer pPVar2;
  pointer pPVar3;
  
  pPVar1 = (this->explicit_items).
           super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
           super__Vector_impl_data._M_start;
  pPVar2 = (this->explicit_items).
           super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pPVar3 = pPVar1;
  if (pPVar2 != pPVar1) {
    do {
      Path::~Path(pPVar3);
      pPVar3 = pPVar3 + 1;
    } while (pPVar3 != pPVar2);
    (this->explicit_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
    _M_impl.super__Vector_impl_data._M_finish = pPVar1;
  }
  pPVar1 = (this->added_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pPVar2 = (this->added_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pPVar3 = pPVar1;
  if (pPVar2 != pPVar1) {
    do {
      Path::~Path(pPVar3);
      pPVar3 = pPVar3 + 1;
    } while (pPVar3 != pPVar2);
    (this->added_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
    super__Vector_impl_data._M_finish = pPVar1;
  }
  pPVar1 = (this->prepended_items).
           super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
           super__Vector_impl_data._M_start;
  pPVar2 = (this->prepended_items).
           super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pPVar3 = pPVar1;
  if (pPVar2 != pPVar1) {
    do {
      Path::~Path(pPVar3);
      pPVar3 = pPVar3 + 1;
    } while (pPVar3 != pPVar2);
    (this->prepended_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
    _M_impl.super__Vector_impl_data._M_finish = pPVar1;
  }
  pPVar1 = (this->appended_items).
           super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
           super__Vector_impl_data._M_start;
  pPVar2 = (this->appended_items).
           super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pPVar3 = pPVar1;
  if (pPVar2 != pPVar1) {
    do {
      Path::~Path(pPVar3);
      pPVar3 = pPVar3 + 1;
    } while (pPVar3 != pPVar2);
    (this->appended_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
    _M_impl.super__Vector_impl_data._M_finish = pPVar1;
  }
  pPVar1 = (this->deleted_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pPVar2 = (this->deleted_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pPVar3 = pPVar1;
  if (pPVar2 != pPVar1) {
    do {
      Path::~Path(pPVar3);
      pPVar3 = pPVar3 + 1;
    } while (pPVar3 != pPVar2);
    (this->deleted_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
    _M_impl.super__Vector_impl_data._M_finish = pPVar1;
  }
  pPVar1 = (this->ordered_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pPVar2 = (this->ordered_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pPVar3 = pPVar1;
  if (pPVar2 != pPVar1) {
    do {
      Path::~Path(pPVar3);
      pPVar3 = pPVar3 + 1;
    } while (pPVar3 != pPVar2);
    (this->ordered_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
    _M_impl.super__Vector_impl_data._M_finish = pPVar1;
  }
  this->is_explicit = true;
  return;
}

Assistant:

void ClearAndMakeExplicit() {
    explicit_items.clear();
    added_items.clear();
    prepended_items.clear();
    appended_items.clear();
    deleted_items.clear();
    ordered_items.clear();

    is_explicit = true;
  }